

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

IStreamingReporter * __thiscall
Catch::ReporterRegistry::create
          (ReporterRegistry *this,string *name,Ptr<const_Catch::IConfig> *config)

{
  bool bVar1;
  int iVar2;
  pointer ppVar3;
  IReporterFactory *pIVar4;
  undefined4 extraout_var;
  ReporterConfig local_48;
  _Self local_38;
  _Self local_30;
  const_iterator it;
  Ptr<const_Catch::IConfig> *config_local;
  string *name_local;
  ReporterRegistry *this_local;
  
  it._M_node = (_Base_ptr)config;
  local_30._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Ptr<Catch::IReporterFactory>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Ptr<Catch::IReporterFactory>_>_>_>
       ::find(&this->m_factories,name);
  local_38._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Ptr<Catch::IReporterFactory>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Ptr<Catch::IReporterFactory>_>_>_>
       ::end(&this->m_factories);
  bVar1 = std::operator==(&local_30,&local_38);
  if (bVar1) {
    this_local = (ReporterRegistry *)0x0;
  }
  else {
    ppVar3 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Ptr<Catch::IReporterFactory>_>_>
             ::operator->(&local_30);
    pIVar4 = Ptr<Catch::IReporterFactory>::operator->(&ppVar3->second);
    ReporterConfig::ReporterConfig(&local_48,(Ptr<const_Catch::IConfig> *)it._M_node);
    iVar2 = (*(pIVar4->super_IShared).super_NonCopyable._vptr_NonCopyable[4])(pIVar4,&local_48);
    this_local = (ReporterRegistry *)CONCAT44(extraout_var,iVar2);
    ReporterConfig::~ReporterConfig(&local_48);
  }
  return (IStreamingReporter *)this_local;
}

Assistant:

virtual IStreamingReporter* create( std::string const& name, Ptr<IConfig const> const& config ) const CATCH_OVERRIDE {
            FactoryMap::const_iterator it =  m_factories.find( name );
            if( it == m_factories.end() )
                return CATCH_NULL;
            return it->second->create( ReporterConfig( config ) );
        }